

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O2

BOOL __thiscall
Js::ModuleRoot::GetAccessors
          (ModuleRoot *this,PropertyId propertyId,Var *getter,Var *setter,
          ScriptContext *requestContext)

{
  HostObjectBase *pHVar1;
  BOOL BVar2;
  
  BVar2 = DynamicObject::GetAccessors((DynamicObject *)this,propertyId,getter,setter,requestContext)
  ;
  if (BVar2 != 0) {
    return 1;
  }
  pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
  if (pHVar1 != (HostObjectBase *)0x0) {
    BVar2 = (**(code **)(*(long *)pHVar1 + 0xa8))(pHVar1,propertyId,getter,setter,requestContext);
    return BVar2;
  }
  BVar2 = GlobalObject::GetAccessors
                    ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     globalObject.ptr,propertyId,getter,setter,requestContext);
  return BVar2;
}

Assistant:

BOOL ModuleRoot::GetAccessors(PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter, ScriptContext* requestContext)
    {
        if (DynamicObject::GetAccessors(propertyId, getter, setter, requestContext))
        {
            return TRUE;
        }
        if (this->hostObject)
        {
            return this->hostObject->GetAccessors(propertyId, getter, setter, requestContext);
        }

        // Try checking the global object
        GlobalObject* globalObj = this->GetLibrary()->GetGlobalObject();
        return globalObj->GlobalObject::GetAccessors(propertyId, getter, setter, requestContext);
    }